

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O1

boolean e_survives_at(entity *etmp,int x,int y)

{
  char cVar1;
  uint uVar2;
  boolean bVar3;
  permonst *ppVar4;
  byte bVar5;
  bool bVar6;
  
  ppVar4 = etmp->edata;
  if (ppVar4->mlet == '6') {
    return '\x01';
  }
  bVar6 = x - 1U < 0x4f;
  if ((uint)y < 0x15 && bVar6) {
    cVar1 = level->locations[(uint)x][(uint)y].typ;
    if (((byte)(cVar1 - 0x11U) < 3) ||
       ((cVar1 == '\x14' &&
        ((*(ushort *)&level->locations[(uint)x][(uint)y].field_0x6 & 0x1c0) == 0)))) {
      if (etmp->emon == &youmonst) {
        if ((u.uprops[0x27].extrinsic != 0) &&
           (bVar3 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar3 == '\0')) {
          return '\x01';
        }
        if (u.uprops[0x31].intrinsic != 0) {
          return '\x01';
        }
        if (u.uprops[0x31].extrinsic != 0) {
          return '\x01';
        }
        uVar2 = (youmonst.data)->mflags1;
        if ((uVar2 & 2) != 0) {
          return '\x01';
        }
        if ((uVar2 & 0x600) != 0) {
          return '\x01';
        }
        if (u.uprops[0x39].intrinsic != 0) {
          return '\x01';
        }
        if (u.uprops[0x39].extrinsic != 0) {
          return '\x01';
        }
        if (u.usteed == (monst *)0x0) {
          if (u.uprops[0x3c].extrinsic != 0) {
            return '\x01';
          }
        }
        else if (((u.usteed)->data->mflags1 & 2) != 0 || u.uprops[0x3c].extrinsic != 0) {
          return '\x01';
        }
        if ((uVar2 & 1) != 0) {
          return '\x01';
        }
        if (u.usteed == (monst *)0x0) {
          if (u.uprops[0x12].intrinsic != 0) {
            return '\x01';
          }
        }
        else if (((u.usteed)->data->mflags1 & 1) != 0 || u.uprops[0x12].intrinsic != 0) {
          return '\x01';
        }
        if (u.uprops[0x12].extrinsic != 0) {
          return '\x01';
        }
        if ((youmonst.data)->mlet == '\x05') {
          return '\x01';
        }
      }
      if ((etmp->edata->mflags1 & 3) != 0) {
        return '\x01';
      }
      return etmp->edata->mlet == '\x05';
    }
    if (((uint)y < 0x15 && bVar6) &&
       ((cVar1 = level->locations[(uint)x][(uint)y].typ, cVar1 == '\x15' ||
        ((cVar1 == '\x14' &&
         ((*(uint *)&level->locations[(uint)x][(uint)y].field_0x6 & 0x1c0) == 0x40)))))) {
      if (etmp->emon == &youmonst) {
        if (u.uprops[0x12].extrinsic != 0 || u.uprops[0x12].intrinsic != 0) {
          return '\x01';
        }
        if ((youmonst.data)->mlet == '\x05') {
          return '\x01';
        }
        if (u.uprops[0x3c].extrinsic != 0) {
          return '\x01';
        }
        if (((youmonst.data)->mflags1 & 1) != 0) {
          return '\x01';
        }
        if ((u.usteed != (monst *)0x0) && (((u.usteed)->data->mflags1 & 1) != 0)) {
          return '\x01';
        }
      }
      if (ppVar4 == mons + 0x157 || ppVar4 == mons + 0xa0) {
        return '\x01';
      }
      bVar5 = (byte)ppVar4->mflags1;
      goto LAB_0015f531;
    }
  }
  if (level->locations[x][y].typ != '\f') {
    return '\x01';
  }
  if ((etmp->emon == &youmonst) &&
     (ppVar4 = youmonst.data, u.uprops[0x3e].extrinsic != 0 || u.uprops[0x3e].intrinsic != 0)) {
    return '\x01';
  }
  bVar5 = (byte)ppVar4->mflags1 >> 3;
LAB_0015f531:
  return bVar5 & 1;
}

Assistant:

static boolean e_survives_at(struct entity *etmp, int x, int y)
{
	if (noncorporeal(etmp->edata))
		return TRUE;
	if (is_pool(level, x, y))
		return (boolean)((is_u(etmp) &&
				(Wwalking || Amphibious || Swimming ||
				Flying || Levitation)) ||
			is_swimmer(etmp->edata) || is_flyer(etmp->edata) ||
			is_floater(etmp->edata));
	/* must force call to lava_effects in e_died if is_u */
	if (is_lava(level, x, y))
		return (boolean)((is_u(etmp) && (Levitation || Flying)) ||
			    likes_lava(etmp->edata) || is_flyer(etmp->edata));
	if (is_db_wall(x, y))
		return((boolean)(is_u(etmp) ? Passes_walls :
			passes_walls(etmp->edata)));
	return TRUE;
}